

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O2

void MyCompiler::Util::processAst<MyCompiler::Block>
               (Block *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  ConstDeclaration *ast_00;
  VarDeclaration *ast_01;
  pointer pPVar1;
  Statement *ast_02;
  int iVar2;
  ProcedureDeclaration *subAst;
  pointer ast_03;
  allocator local_65;
  int local_64;
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
  *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Block *local_38;
  
  local_64 = level;
  std::operator+(&local_58,name,":");
  local_60 = (vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items;
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_64,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar2 = local_64;
  ast_00 = (ast->pConstDeclaration).
           super___shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ast_00 != (ConstDeclaration *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"const-declaration",&local_65);
    name = &local_58;
    processAst<MyCompiler::ConstDeclaration>
              (ast_00,iVar2 + 1,
               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_60,name);
    std::__cxx11::string::~string((string *)&local_58);
  }
  iVar2 = local_64;
  ast_01 = (ast->pVarDeclaration).
           super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ast_01 != (VarDeclaration *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"var-declaration",&local_65);
    name = &local_58;
    processAst<MyCompiler::VarDeclaration>
              (ast_01,iVar2 + 1,
               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_60,name);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_38 = ast;
  if ((ast->vProcedureDeclaration).
      super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (ast->vProcedureDeclaration).
      super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58._M_dataplus._M_p._0_4_ = local_64 + 1;
    std::
    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
    ::emplace_back<int,char_const(&)[24]>
              (local_60,(int *)&local_58,(char (*) [24])"procedure-declarations:");
    pPVar1 = (local_38->vProcedureDeclaration).
             super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ast_03 = (local_38->vProcedureDeclaration).
                  super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start; iVar2 = local_64, ast_03 != pPVar1;
        ast_03 = ast_03 + 1) {
      std::__cxx11::string::string((string *)&local_58,"",&local_65);
      processAst<MyCompiler::ProcedureDeclaration>
                (ast_03,iVar2 + 2,
                 (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_60,name);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  iVar2 = local_64;
  ast_02 = (local_38->pStatement).
           super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_58,"",&local_65);
  processAst<MyCompiler::Statement>
            (ast_02,iVar2 + 1,
             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_60,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::Block>(
        Block &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, name + ":");
    if (ast.pConstDeclaration != nullptr)
        processAst(*ast.pConstDeclaration, level + 1, items, "const-declaration");
    if (ast.pVarDeclaration != nullptr)
        processAst(*ast.pVarDeclaration, level + 1, items, "var-declaration");
    if (!ast.vProcedureDeclaration.empty())
    {
        items.emplace_back(level + 1, "procedure-declarations:");
        for (ProcedureDeclaration &subAst : ast.vProcedureDeclaration)
            processAst(subAst, level + 2, items, "");
    }
    processAst(*ast.pStatement, level + 1, items, "");
}